

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_STRIKE(effect_handler_context_t *context)

{
  loc_conflict grid1;
  _Bool _Var1;
  source sVar2;
  source origin;
  loc_conflict lStack_24;
  wchar_t flg;
  loc_conflict target;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  unique0x1000013e = context;
  target.x = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  lStack_24.x = (player->grid).x;
  lStack_24.y = (player->grid).y;
  if ((stack0xffffffffffffffe8->dir == L'\x05') && (_Var1 = target_okay(), _Var1)) {
    target_get((loc *)&lStack_24);
  }
  grid1.x = (player->grid).x;
  grid1.y = (player->grid).y;
  _Var1 = projectable((chunk *)cave,grid1,lStack_24,L'\0');
  if ((_Var1) && (_Var1 = square_isknown((chunk *)cave,lStack_24), _Var1)) {
    sVar2 = source_player();
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    origin.which.trap = sVar2.which.trap;
    _Var1 = project(origin,stack0xffffffffffffffe8->radius,lStack_24,target.x,
                    stack0xffffffffffffffe8->subtype,L'q',L'\0','\0',stack0xffffffffffffffe8->obj);
    if (_Var1) {
      stack0xffffffffffffffe8->ident = true;
    }
    context_local._7_1_ = true;
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_STRIKE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	struct loc target = player->grid;
	int flg = PROJECT_JUMP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Ask for a target; if no direction given, the player is struck  */
	if ((context->dir == DIR_TARGET) && target_okay()) {
		target_get(&target);
	}

	/* Enforce line of sight */
	if (!projectable(cave, player->grid, target, PROJECT_NONE) ||
		!square_isknown(cave, target)) {
		return false;
	}

	/* Aim at the target.  Hurt items on floor. */
	if (project(source_player(), context->radius, target, dam, context->subtype,
				flg, 0, 0, context->obj)) {
		context->ident = true;
	}

	return true;
}